

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O2

void __thiscall
Corrade::Containers::BasicStringView<char>::BasicStringView
          (BasicStringView<char> *this,char *data,size_t size,StringViewFlags flags)

{
  anon_class_1_0_00000001 local_19;
  
  this->_data = data;
  if (((byte)(flags._value >> 0x3e) & 1 & data == (char *)0x0) == 1) {
    BasicStringView::anon_class_1_0_00000001::operator()(&local_19);
  }
  this->_sizePlusFlags = flags._value & 0xc000000000000000 | size;
  return;
}

Assistant:

constexpr /*implicit*/ BasicStringView(T* data, std::size_t size, StringViewFlags flags = {}) noexcept: _data{data}, _sizePlusFlags{(
            /* This ends up being called from BasicStringView(T*, Flags), so
               basically on every implicit conversion from a C string, thus
               the release build perf aspect wins over safety. Additionally,
               it makes little sense to check the size constraint on 64-bit, if
               64-bit code happens to go over then it's got bigger problems
               than this assert. */
            #ifdef CORRADE_TARGET_32BIT
            CORRADE_CONSTEXPR_DEBUG_ASSERT(size < std::size_t{1} << (sizeof(std::size_t)*8 - 2),
                "Containers::StringView: string expected to be smaller than 2^" << Utility::Debug::nospace << sizeof(std::size_t)*8 - 2 << "bytes, got" << size),
            #endif
            CORRADE_CONSTEXPR_DEBUG_ASSERT(data || !(flags & StringViewFlag::NullTerminated),
                "Containers::StringView: can't use StringViewFlag::NullTerminated with null data"),
            size|(std::size_t(flags) & Implementation::StringViewSizeMask))} {}